

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.cpp
# Opt level: O3

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  size_t n;
  char *p;
  uint uVar5;
  ulong uVar6;
  size_t __maxlen;
  ulong uVar7;
  bool bVar8;
  undefined8 uVar9;
  
  iVar4 = -100;
  if (size < 0x80000000) {
    uVar9 = 0xffffff9c;
    uVar3 = oid->len;
    iVar4 = -0x60;
    if (uVar3 != 0) {
      uVar7 = 0;
      __maxlen = size;
      do {
        uVar6 = 0;
        while( true ) {
          uVar5 = (uint)uVar6;
          if (0x1ffffff < uVar5) {
            return -0x68;
          }
          bVar1 = oid->p[uVar7];
          if (uVar5 == 0 && bVar1 == 0x80) {
            return -0x68;
          }
          uVar5 = bVar1 & 0x7f | uVar5 << 7;
          uVar6 = (ulong)uVar5;
          if (-1 < (char)bVar1) break;
          uVar7 = uVar7 + 1;
          if (uVar3 <= uVar7) {
            if (uVar5 != 0) {
              return -0x60;
            }
            goto LAB_0121a0a1;
          }
        }
        if (__maxlen == size) {
          if (uVar5 < 0x50) {
            uVar3 = (ulong)(0x31 - (uVar5 < 0x28));
            uVar2 = uVar5 - 0x28;
            if (uVar5 < 0x28) {
              uVar2 = uVar5;
            }
          }
          else {
            uVar3 = 0x32;
            uVar2 = uVar5 - 0x50;
          }
          uVar5 = snprintf(buf,size,"%c.%u",uVar3,(ulong)uVar2,bVar1,uVar9);
        }
        else {
          uVar5 = snprintf(buf,__maxlen,".%u",uVar6,uVar6,bVar1,uVar9);
        }
        if ((int)uVar5 < 2) {
          return -0xb;
        }
        uVar3 = (ulong)uVar5;
        bVar8 = __maxlen < uVar3;
        __maxlen = __maxlen - uVar3;
        if (bVar8 || __maxlen == 0) {
          return -0xb;
        }
        buf = buf + uVar3;
        uVar3 = oid->len;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar3);
LAB_0121a0a1:
      iVar4 = (int)size - (int)__maxlen;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_oid_get_numeric_string(char *buf, size_t size,
                                   const mbedtls_asn1_buf *oid)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    unsigned int value = 0;

    if (size > INT_MAX) {
        /* Avoid overflow computing return value */
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    if (oid->len <= 0) {
        /* OID must not be empty */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    for (size_t i = 0; i < oid->len; i++) {
        /* Prevent overflow in value. */
        if (value > (UINT_MAX >> 7)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        if ((value == 0) && ((oid->p[i]) == 0x80)) {
            /* Overlong encoding is not allowed */
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }

        value <<= 7;
        value |= oid->p[i] & 0x7F;

        if (!(oid->p[i] & 0x80)) {
            /* Last byte */
            if (n == size) {
                int component1;
                unsigned int component2;
                /* First subidentifier contains first two OID components */
                if (value >= 80) {
                    component1 = '2';
                    component2 = value - 80;
                } else if (value >= 40) {
                    component1 = '1';
                    component2 = value - 40;
                } else {
                    component1 = '0';
                    component2 = value;
                }
                ret = mbedtls_snprintf(p, n, "%c.%u", component1, component2);
            } else {
                ret = mbedtls_snprintf(p, n, ".%u", value);
            }
            if (ret < 2 || (size_t) ret >= n) {
                return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
            }
            n -= (size_t) ret;
            p += ret;
            value = 0;
        }
    }

    if (value != 0) {
        /* Unterminated subidentifier */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return (int) (size - n);
}